

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeating_task.cc
# Opt level: O2

bool __thiscall dd::RepeatingTaskBase::Run(RepeatingTaskBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  rep rVar2;
  long lVar3;
  pointer *__ptr;
  bool bVar4;
  long lVar5;
  RepeatingTaskBase *local_28;
  
  bVar4 = true;
  if (this->_next_run_time != 0x7fffffffffffffff) {
    iVar1 = (*(this->super_QueuedTask)._vptr_QueuedTask[3])();
    if (this->_next_run_time != 0x7fffffffffffffff) {
      rVar2 = GetCurrentTick();
      lVar5 = (CONCAT44(extraout_var,iVar1) - rVar2) + this->_next_run_time;
      lVar3 = 0;
      if (0 < lVar5) {
        lVar3 = lVar5;
      }
      this->_next_run_time = this->_next_run_time + CONCAT44(extraout_var,iVar1);
      local_28 = this;
      (*this->_task_queue->_vptr_TaskQueueBase[2])(this->_task_queue,&local_28,lVar3);
      if (local_28 != (RepeatingTaskBase *)0x0) {
        (*(local_28->super_QueuedTask)._vptr_QueuedTask[1])();
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool RepeatingTaskBase::Run() {
		if (IsPlusInfinity(_next_run_time))
			return true;
		auto delay = RunClosure();
		if (IsPlusInfinity(_next_run_time))
			return true;

		uint64_t lost_time = GetCurrentTick() - _next_run_time;
		_next_run_time += delay;
		delay -= lost_time;
		delay = delay > 0 ? delay : 0;// (std::max)(delay, 0);
		_task_queue->PostDelayedTask(std::unique_ptr<RepeatingTaskBase>(this), delay);
		return false;
	}